

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

SegmentAnd<capnp::Text::Builder> * __thiscall
capnp::_::WireHelpers::setTextPointer
          (SegmentAnd<capnp::Text::Builder> *__return_storage_ptr__,WireHelpers *this,
          WirePointer *ref,SegmentBuilder *segment,CapTableBuilder *capTable,Reader value,
          BuilderArena *orphanArena)

{
  size_t i;
  unsigned_long uVar1;
  WireHelpers *this_00;
  SegmentBuilder *pSVar2;
  StringPtr from;
  anon_class_1_0_00000001 local_35;
  TextSize local_34;
  SegmentBuilder *pSStack_30;
  TextSize size;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  WirePointer *ref_local;
  Reader value_local;
  
  pSStack_30 = segment;
  capTable_local = (CapTableBuilder *)ref;
  segment_local = (SegmentBuilder *)this;
  ref_local = (WirePointer *)capTable;
  value_local.super_StringPtr.content.ptr = (char *)orphanArena;
  i = kj::StringPtr::size((StringPtr *)&ref_local);
  uVar1 = bounded<unsigned_long>(i);
  uVar1 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::setTextPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::Text::Reader,capnp::_::BuilderArena*)::_lambda()_1_>
                    (uVar1,&local_35);
  local_34 = (TextSize)uVar1;
  pSVar2 = pSStack_30;
  initTextPointer(__return_storage_ptr__,(WirePointer *)segment_local,
                  (SegmentBuilder *)capTable_local,(CapTableBuilder *)pSStack_30,local_34,
                  (BuilderArena *)value.super_StringPtr.content.ptr);
  this_00 = (WireHelpers *)Text::Builder::begin(&__return_storage_ptr__->value);
  from.content.size_ = (size_t)pSVar2;
  from.content.ptr = value_local.super_StringPtr.content.ptr;
  copyMemory(this_00,(char *)ref_local,from);
  return __return_storage_ptr__;
}

Assistant:

static KJ_ALWAYS_INLINE(SegmentAnd<Text::Builder> setTextPointer(
      WirePointer* ref, SegmentBuilder* segment, CapTableBuilder* capTable, Text::Reader value,
      BuilderArena* orphanArena = nullptr)) {
    TextSize size = assertMax<MAX_TEXT_SIZE>(bounded(value.size()),
        []() { KJ_FAIL_REQUIRE("text blob too big"); }) * BYTES;

    auto allocation = initTextPointer(ref, segment, capTable, size, orphanArena);
    copyMemory(allocation.value.begin(), value);
    return allocation;
  }